

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readScatteringLaw.hpp
# Opt level: O2

ScatteringLaw * __thiscall
njoy::ENDFtk::section::Type<7,2>::
readScatteringLaw<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (ScatteringLaw *__return_storage_ptr__,Type<7,2> *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT,int LTHR)

{
  undefined8 *puVar1;
  int MAT_00;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  MixedElastic local_158;
  
  MAT_00 = (int)lineNumber;
  if (MT == 3) {
    MixedElastic::MixedElastic<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((MixedElastic *)&local_158,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,MAT_00,MAT,MF);
    std::
    variant<njoy::ENDFtk::section::Type<7,2>::CoherentElastic,njoy::ENDFtk::section::Type<7,2>::IncoherentElastic,njoy::ENDFtk::section::Type<7,2>::MixedElastic>
    ::
    variant<njoy::ENDFtk::section::Type<7,2>::MixedElastic,void,void,njoy::ENDFtk::section::Type<7,2>::MixedElastic,void>
              ((variant<njoy::ENDFtk::section::Type<7,2>::CoherentElastic,njoy::ENDFtk::section::Type<7,2>::IncoherentElastic,njoy::ENDFtk::section::Type<7,2>::MixedElastic>
                *)__return_storage_ptr__,&local_158);
    Type<7,_2>::MixedElastic::~MixedElastic(&local_158);
  }
  else if (MT == 2) {
    IncoherentElastic::IncoherentElastic<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((IncoherentElastic *)&local_158,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,MAT_00,MAT,MF);
    std::
    variant<njoy::ENDFtk::section::Type<7,2>::CoherentElastic,njoy::ENDFtk::section::Type<7,2>::IncoherentElastic,njoy::ENDFtk::section::Type<7,2>::MixedElastic>
    ::
    variant<njoy::ENDFtk::section::Type<7,2>::IncoherentElastic,void,void,njoy::ENDFtk::section::Type<7,2>::IncoherentElastic,void>
              ((variant<njoy::ENDFtk::section::Type<7,2>::CoherentElastic,njoy::ENDFtk::section::Type<7,2>::IncoherentElastic,njoy::ENDFtk::section::Type<7,2>::MixedElastic>
                *)__return_storage_ptr__,(IncoherentElastic *)&local_158);
    TabulationRecord::~TabulationRecord((TabulationRecord *)&local_158);
  }
  else {
    if (MT != 1) {
      tools::Log::error<char_const*>
                ((char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      tools::Log::info<char_const*>
                ((char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      tools::Log::info<char_const*,int>("LTHR value: {}",MT);
      tools::Log::info<char_const*,long>("Line number: {}",(long)end->_M_current);
      puVar1 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar1 = getenv;
      __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
    }
    CoherentElastic::CoherentElastic<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((CoherentElastic *)&local_158,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,MAT_00,MAT,MF);
    std::
    variant<njoy::ENDFtk::section::Type<7,2>::CoherentElastic,njoy::ENDFtk::section::Type<7,2>::IncoherentElastic,njoy::ENDFtk::section::Type<7,2>::MixedElastic>
    ::
    variant<njoy::ENDFtk::section::Type<7,2>::CoherentElastic,void,void,njoy::ENDFtk::section::Type<7,2>::CoherentElastic,void>
              ((variant<njoy::ENDFtk::section::Type<7,2>::CoherentElastic,njoy::ENDFtk::section::Type<7,2>::IncoherentElastic,njoy::ENDFtk::section::Type<7,2>::MixedElastic>
                *)__return_storage_ptr__,&local_158.coherent_);
    Type<7,_2>::CoherentElastic::~CoherentElastic(&local_158.coherent_);
  }
  return __return_storage_ptr__;
}

Assistant:

static ScatteringLaw
readScatteringLaw( Iterator& begin,
                   const Iterator& end,
                   long& lineNumber,
                   int MAT,
                   int MF,
                   int MT,
                   int LTHR ) {

  switch ( LTHR ) {
    case 1: return CoherentElastic( begin, end, lineNumber, MAT, MF, MT );
    case 2: return IncoherentElastic( begin, end, lineNumber, MAT, MF, MT );
    case 3: return MixedElastic( begin, end, lineNumber, MAT, MF, MT );
    default : {
      Log::error( "Encountered illegal LTHR value" );
      Log::info( "LTHR is either 1 (coherent), 2 (incoherent) or 3 (mixed)" );
      Log::info( "LTHR value: {}", LTHR );
      Log::info( "Line number: {}", lineNumber );
      throw std::exception();
    }
  }
}